

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Cluster::GetLast(Cluster *this,BlockEntry **pLast)

{
  long lVar1;
  undefined8 *in_RSI;
  long in_RDI;
  long idx;
  long status;
  long len;
  longlong pos;
  long *in_stack_00000048;
  longlong *in_stack_00000050;
  Cluster *in_stack_00000058;
  
  do {
    lVar1 = Parse(in_stack_00000058,in_stack_00000050,in_stack_00000048);
    if (lVar1 < 0) {
      *in_RSI = 0;
      return lVar1;
    }
  } while (lVar1 < 1);
  if (*(long *)(in_RDI + 0x40) < 1) {
    *in_RSI = 0;
  }
  else {
    *in_RSI = *(undefined8 *)(*(long *)(in_RDI + 0x30) + (*(long *)(in_RDI + 0x40) + -1) * 8);
  }
  return 0;
}

Assistant:

long Cluster::GetLast(const BlockEntry*& pLast) const {
  for (;;) {
    long long pos;
    long len;

    const long status = Parse(pos, len);

    if (status < 0) {  // error
      pLast = NULL;
      return status;
    }

    if (status > 0)  // no new block
      break;
  }

  if (m_entries_count <= 0) {
    pLast = NULL;
    return 0;
  }

  assert(m_entries);

  const long idx = m_entries_count - 1;

  pLast = m_entries[idx];
  assert(pLast);

  return 0;
}